

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void init_proc_750cx(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  CPUPPCState_conflict3 *__mptr;
  undefined8 uVar2;
  
  gen_spr_ne_601(env);
  gen_spr_sdr1(env);
  gen_spr_7xx(env);
  if ((((env->spr_cb[0x3f9].name == (char *)0x0) && (env->spr[0x3f9] == 0)) &&
      (env->spr_cb[0x3f9].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3f9].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3f9].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3f9].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3f9].name = "L2CR";
    env->spr_cb[0x3f9].uea_read = spr_noaccess;
    env->spr_cb[0x3f9].uea_write = spr_noaccess;
    env->spr_cb[0x3f9].oea_read = spr_read_generic;
    env->spr_cb[0x3f9].oea_write = spr_access_nop;
    env->spr_cb[0x3f9].hea_read = spr_read_generic;
    env->spr_cb[0x3f9].hea_write = spr_access_nop;
    env->spr_cb[0x3f9].default_value = 0;
    env->spr[0x3f9] = 0;
    gen_tbl(env);
    gen_spr_thrm(env);
    if (((env->spr_cb[0x3bf].name == (char *)0x0) && (env->spr[0x3bf] == 0)) &&
       ((env->spr_cb[0x3bf].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3bf].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3bf].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3bf].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3bf].name = "SDA";
      env->spr_cb[0x3bf].uea_read = spr_noaccess;
      env->spr_cb[0x3bf].uea_write = spr_noaccess;
      env->spr_cb[0x3bf].oea_read = spr_read_generic;
      env->spr_cb[0x3bf].oea_write = spr_write_generic;
      env->spr_cb[0x3bf].hea_read = spr_read_generic;
      env->spr_cb[0x3bf].hea_write = spr_write_generic;
      env->spr_cb[0x3bf].default_value = 0;
      env->spr[0x3bf] = 0;
      if (((env->spr_cb[0x3f0].name == (char *)0x0) && (env->spr[0x3f0] == 0)) &&
         (((env->spr_cb[0x3f0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3f0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3f0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x3f0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x3f0].name = "HID0";
        env->spr_cb[0x3f0].uea_read = spr_noaccess;
        env->spr_cb[0x3f0].uea_write = spr_noaccess;
        env->spr_cb[0x3f0].oea_read = spr_read_generic;
        env->spr_cb[0x3f0].oea_write = spr_write_generic;
        env->spr_cb[0x3f0].hea_read = spr_read_generic;
        env->spr_cb[0x3f0].hea_write = spr_write_generic;
        env->spr_cb[0x3f0].default_value = 0;
        env->spr[0x3f0] = 0;
        if (((((env->spr_cb[0x3f1].name == (char *)0x0) && (env->spr[0x3f1] == 0)) &&
             (env->spr_cb[0x3f1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x3f1].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x3f1].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x3f1].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x3f1].name = "HID1";
          env->spr_cb[0x3f1].uea_read = spr_noaccess;
          env->spr_cb[0x3f1].uea_write = spr_noaccess;
          env->spr_cb[0x3f1].oea_read = spr_read_generic;
          env->spr_cb[0x3f1].oea_write = spr_write_generic;
          env->spr_cb[0x3f1].hea_read = spr_read_generic;
          env->spr_cb[0x3f1].hea_write = spr_write_generic;
          env->spr_cb[0x3f1].default_value = 0;
          env->spr[0x3f1] = 0;
          gen_low_BATs(env);
          gen_high_BATs(env);
          env->excp_vectors[0x40] = 0x100;
          env->excp_vectors[1] = 0x200;
          env->excp_vectors[2] = 0x300;
          env->excp_vectors[3] = 0x400;
          env->excp_vectors[4] = 0x500;
          env->excp_vectors[5] = 0x600;
          env->excp_vectors[6] = 0x700;
          env->excp_vectors[7] = 0x800;
          env->excp_vectors[10] = 0x900;
          env->excp_vectors[8] = 0xc00;
          env->excp_vectors[0x44] = 0xd00;
          env->excp_vectors[0x55] = 0xf00;
          env->excp_vectors[0x53] = 0x1300;
          env->excp_vectors[0x56] = 0x1700;
          env->hreset_vector = 0x100;
          env->dcache_line_size = 0x20;
          env->icache_line_size = 0x20;
          ppc6xx_irq_init_ppc64((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
          return;
        }
        uVar2 = 0x3f1;
        uVar1 = 0x3f1;
      }
      else {
        uVar2 = 0x3f0;
        uVar1 = 0x3f0;
      }
    }
    else {
      uVar2 = 0x3bf;
      uVar1 = 0x3bf;
    }
  }
  else {
    uVar2 = 0x3f9;
    uVar1 = 0x3f9;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void init_proc_750cx(CPUPPCState *env)
{
    gen_spr_ne_601(env);
    gen_spr_sdr1(env);
    gen_spr_7xx(env);
    /* XXX : not implemented */
    spr_register(env, SPR_L2CR, "L2CR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, spr_access_nop,
                 0x00000000);
    /* Time base */
    gen_tbl(env);
    /* Thermal management */
    gen_spr_thrm(env);
    /* This register is not implemented but is present for compatibility */
    spr_register(env, SPR_SDA, "SDA",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Hardware implementation registers */
    /* XXX : not implemented */
    spr_register(env, SPR_HID0, "HID0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_HID1, "HID1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Memory management */
    gen_low_BATs(env);
    /* PowerPC 750cx has 8 DBATs and 8 IBATs */
    gen_high_BATs(env);
    init_excp_750cx(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc6xx_irq_init(env_archcpu(env));
}